

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor *
ggml_conv_2d_dw(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,int s0,int s1,int p0,int p1,int d0,
               int d1)

{
  ggml_tensor *ctx_00;
  ggml_tensor *a_00;
  ggml_tensor *ne0;
  ggml_tensor *pgVar1;
  ggml_tensor *ne1;
  ggml_tensor *in_RDI;
  undefined1 unaff_retaddr;
  int unaff_retaddr_00;
  int in_stack_00000008;
  int in_stack_0000000c;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000014;
  undefined4 in_stack_00000018;
  undefined4 in_stack_0000001c;
  ggml_context *in_stack_00000020;
  int in_stack_00000030;
  int in_stack_00000038;
  ggml_tensor *result;
  ggml_tensor *new_b;
  ggml_tensor *im2col;
  ggml_tensor *new_a;
  ggml_tensor *in_stack_ffffffffffffffa0;
  int64_t in_stack_ffffffffffffffa8;
  int64_t in_stack_ffffffffffffffb0;
  int64_t in_stack_ffffffffffffffb8;
  int64_t in_stack_ffffffffffffffc0;
  ggml_tensor *in_stack_ffffffffffffffc8;
  ggml_context *in_stack_ffffffffffffffd0;
  
  ctx_00 = ggml_reshape_4d(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                           in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                           in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pgVar1 = ctx_00;
  ggml_reshape_4d((ggml_context *)ctx_00,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                  in_stack_ffffffffffffffb8,(int64_t)ctx_00,(int64_t)in_RDI);
  a_00 = ggml_im2col(in_stack_00000020,(ggml_tensor *)CONCAT44(in_stack_0000001c,in_stack_00000018),
                     (ggml_tensor *)CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_0000000c,
                     in_stack_00000008,unaff_retaddr_00,in_stack_00000030,in_stack_00000038,
                     (int)result,(_Bool)unaff_retaddr,(ggml_type)im2col);
  ne0 = ggml_reshape_4d((ggml_context *)pgVar1,a_00,in_stack_ffffffffffffffc0,
                        in_stack_ffffffffffffffb8,(int64_t)ctx_00,(int64_t)in_RDI);
  pgVar1 = ggml_reshape_4d((ggml_context *)pgVar1,a_00,(int64_t)ne0,in_stack_ffffffffffffffb8,
                           (int64_t)ctx_00,(int64_t)in_RDI);
  ne1 = ggml_mul_mat((ggml_context *)ctx_00,in_RDI,in_stack_ffffffffffffffa0);
  pgVar1 = ggml_reshape_4d((ggml_context *)pgVar1,a_00,(int64_t)ne0,(int64_t)ne1,(int64_t)ctx_00,
                           (int64_t)in_RDI);
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_conv_2d_dw(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        int                   s0,
        int                   s1,
        int                   p0,
        int                   p1,
        int                   d0,
        int                   d1) {
    struct ggml_tensor * new_a = ggml_reshape_4d(ctx, a, a->ne[0], a->ne[1], 1, a->ne[2] * a->ne[3]);
    struct ggml_tensor * im2col = ggml_im2col(ctx, new_a,
                                        ggml_reshape_4d(ctx, b, b->ne[0], b->ne[1], 1, b->ne[2] * b->ne[3]),
                                        s0, s1, p0, p1, d0, d1, true, GGML_TYPE_F16); // [N * IC, OH, OW, KH * KW]
    struct ggml_tensor * new_b = ggml_reshape_4d(ctx, im2col, im2col->ne[0], im2col->ne[2] * im2col->ne[1], b->ne[2], b->ne[3]); // [N * IC, OH, OW, KH * KW] => [N, IC, OH * OW, KH * KW]

    new_a = ggml_reshape_4d(ctx, new_a, (new_a->ne[0] * new_a->ne[1]), new_a->ne[2],  new_a->ne[3], 1);                       // [OC，1, KH, KW] => [1, OC, 1, KH * KW]
    struct ggml_tensor * result = ggml_mul_mat(ctx, new_a, new_b);
    result = ggml_reshape_4d(ctx, result, im2col->ne[1], im2col->ne[2], b->ne[2], b->ne[3]); // [N, OC, OH, OW]

    return result;
}